

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_int32_field
          (OneofWellKnownTypes *this,Int32Value *int32_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Int32Value *int32_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (int32_field != (Int32Value *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)int32_field);
    message_arena = (Arena *)int32_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::Int32Value>
                              (message_arena_00,int32_field,submessage_arena_00);
    }
    set_has_int32_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_int32_field(::google::protobuf::Int32Value* PROTOBUF_NULLABLE int32_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (int32_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(int32_field)->GetArena();
    if (message_arena != submessage_arena) {
      int32_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, int32_field, submessage_arena);
    }
    set_has_int32_field();
    _impl_.oneof_field_.int32_field_ = int32_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.int32_field)
}